

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setVisible(WindowImplX11 *this,bool visible)

{
  byte in_SIL;
  long *in_RDI;
  WindowImplX11 *in_stack_00000180;
  byte local_1a;
  byte local_19;
  
  if ((in_SIL & 1) == 0) {
    XUnmapWindow(in_RDI[0x7a],in_RDI[0x79]);
    XFlush(in_RDI[0x7a]);
    while( true ) {
      local_1a = 0;
      if ((*(byte *)((long)in_RDI + 0x46f) & 1) != 0) {
        local_1a = *(byte *)(in_RDI + 0x88) ^ 0xff;
      }
      if ((local_1a & 1) == 0) break;
      (**(code **)(*in_RDI + 0x80))();
    }
  }
  else {
    XMapWindow(in_RDI[0x7a],in_RDI[0x79]);
    if ((*(byte *)((long)in_RDI + 0x46d) & 1) != 0) {
      switchToFullscreen(in_stack_00000180);
    }
    XFlush(in_RDI[0x7a]);
    while( true ) {
      local_19 = 0;
      if ((*(byte *)((long)in_RDI + 0x46f) & 1) == 0) {
        local_19 = *(byte *)(in_RDI + 0x88) ^ 0xff;
      }
      if ((local_19 & 1) == 0) break;
      (**(code **)(*in_RDI + 0x80))();
    }
  }
  return;
}

Assistant:

void WindowImplX11::setVisible(bool visible)
{
    if (visible)
    {
        XMapWindow(m_display, m_window);

        if(m_fullscreen)
            switchToFullscreen();

        XFlush(m_display);

        // Before continuing, make sure the WM has
        // internally marked the window as viewable
        while (!m_windowMapped && !m_isExternal)
            processEvents();
    }
    else
    {
        XUnmapWindow(m_display, m_window);

        XFlush(m_display);

        // Before continuing, make sure the WM has
        // internally marked the window as unviewable
        while (m_windowMapped && !m_isExternal)
            processEvents();
    }
}